

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcDoorStyle::~IfcDoorStyle(IfcDoorStyle *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x100 = 0x939438;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.HasPropertySets.have = 0x939500;
  this[-1].ConstructionType.field_2._M_allocated_capacity = 0x939460;
  this[-1].ParameterTakesPrecedence._M_dataplus._M_p = "(YY";
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject = 0x9394b0;
  *(undefined8 *)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x58 = 0x9394d8;
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0xc8;
  if ((pointer *)puVar1 !=
      (pointer *)
      ((long)&(this->super_IfcTypeProduct).super_IfcTypeObject.HasPropertySets.ptr.
              super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
              .
              super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
              ._M_impl + 8U)) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)
            &(this->super_IfcTypeProduct).super_IfcTypeObject.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x10;
  if (puVar1 != &(this->super_IfcTypeProduct).super_IfcTypeObject.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.field_0x20) {
    operator_delete(puVar1);
  }
  puVar1 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x88;
  if ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL> *)puVar1 !=
      &(this->super_IfcTypeProduct).super_IfcTypeObject.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>) {
    operator_delete(puVar1);
  }
  puVar1 = &this[-1].super_IfcTypeProduct.super_IfcTypeObject.field_0x100;
  puVar2 = *(undefined1 **)&(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x68;
  if (puVar2 != &(this->super_IfcTypeProduct).super_IfcTypeObject.field_0x78) {
    operator_delete(puVar2);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)puVar1,&PTR_construction_vtable_24__00939518);
  operator_delete(puVar1);
  return;
}

Assistant:

IfcDoorStyle() : Object("IfcDoorStyle") {}